

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O0

void find_suite::find_if(void)

{
  initializer_list<int> __l;
  initializer_list<int> input;
  iterator second_begin;
  iterator second_end;
  iterator iVar1;
  iterator iVar2;
  basic_iterator<int> first_begin;
  allocator<int> local_c1;
  int local_c0 [2];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  vector<int,_std::allocator<int>_> expect;
  view_pointer local_88;
  size_type local_80;
  view_pointer local_78;
  size_type local_70;
  basic_iterator<int> where;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  span.member.next = 0;
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  where.current._0_4_ = 0xb;
  where.current._4_4_ = 0x16;
  input._M_len = 4;
  input._M_array = (iterator)&where.current;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_78 = iVar1.parent;
  local_70 = iVar1.current;
  local_88 = iVar2.parent;
  local_80 = iVar2.current;
  first_begin = std::
                find_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,find_suite::find_if()::__0>
                          (local_78,local_70,local_88,local_80);
  local_c0[0] = 0x21;
  local_c0[1] = 0x2c;
  local_b8 = local_c0;
  local_b0 = 2;
  std::allocator<int>::allocator(&local_c1);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_a8,__l,&local_c1);
  std::allocator<int>::~allocator(&local_c1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::end
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_a8);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_a8);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x13e,"void find_suite::find_if()",first_begin,iVar1,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_a8);
  return;
}

Assistant:

void find_if()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    auto where = std::find_if(span.begin(), span.end(), [](int value){ return value > 22; });
    {
        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}